

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O2

void __thiscall spvtools::opt::IRContext::BuildDefUseManager(IRContext *this)

{
  pointer __p;
  _Head_base<0UL,_spvtools::opt::Module_*,_false> local_20;
  pointer local_18;
  
  local_20._M_head_impl =
       (this->module_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>.
       _M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>.
       super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  MakeUnique<spvtools::opt::analysis::DefUseManager,spvtools::opt::Module*>
            ((spvtools *)&local_18,&local_20._M_head_impl);
  __p = local_18;
  local_18 = (pointer)0x0;
  std::
  __uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  ::reset((__uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           *)&this->def_use_mgr_,__p);
  std::
  unique_ptr<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  ::~unique_ptr((unique_ptr<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 *)&local_18);
  *(undefined1 *)&this->valid_analyses_ = (char)this->valid_analyses_ | kAnalysisBegin;
  return;
}

Assistant:

void BuildDefUseManager() {
    def_use_mgr_ = MakeUnique<analysis::DefUseManager>(module());
    valid_analyses_ = valid_analyses_ | kAnalysisDefUse;
  }